

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int update_mvs_and_sad(uint this_sad,FULLPEL_MV *mv,MV_COST_PARAMS *mv_cost_params,uint *best_sad,
                      uint *raw_best_sad,FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  int iVar1;
  uint *in_RCX;
  FULLPEL_MV *in_RSI;
  uint in_EDI;
  uint *in_R8;
  FULLPEL_MV *in_R9;
  uint sad;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  if (in_EDI < *in_RCX) {
    uVar2 = in_EDI;
    iVar1 = mvsad_err_cost_(in_R9,(MV_COST_PARAMS *)CONCAT44(in_stack_ffffffffffffffcc,in_EDI));
    if (uVar2 + iVar1 < *in_RCX) {
      if (in_R8 != (uint *)0x0) {
        *in_R8 = in_EDI;
      }
      *in_RCX = uVar2 + iVar1;
      if (best_mv != (FULLPEL_MV *)0x0) {
        *best_mv = *in_R9;
      }
      *in_R9 = *in_RSI;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int update_mvs_and_sad(const unsigned int this_sad,
                                     const FULLPEL_MV *mv,
                                     const MV_COST_PARAMS *mv_cost_params,
                                     unsigned int *best_sad,
                                     unsigned int *raw_best_sad,
                                     FULLPEL_MV *best_mv,
                                     FULLPEL_MV *second_best_mv) {
  if (this_sad >= *best_sad) return 0;

  // Add the motion vector cost.
  const unsigned int sad = this_sad + mvsad_err_cost_(mv, mv_cost_params);
  if (sad < *best_sad) {
    if (raw_best_sad) *raw_best_sad = this_sad;
    *best_sad = sad;
    if (second_best_mv) *second_best_mv = *best_mv;
    *best_mv = *mv;
    return 1;
  }
  return 0;
}